

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O0

void divsufsortxx::helper::
     fixdown<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long>
               (iterator Td,iterator SA,long i,long size)

{
  value_reference *this;
  long lVar1;
  long lVar2;
  long in_R8;
  long in_R9;
  value_type e;
  value_type d;
  value_type c;
  long t;
  long k;
  long j;
  value_reference *in_stack_fffffffffffffef8;
  value_reference *in_stack_ffffffffffffff00;
  long in_stack_ffffffffffffff08;
  iterator *this_00;
  undefined1 in_stack_ffffffffffffff10 [16];
  undefined8 local_58;
  undefined8 local_40;
  undefined8 local_28;
  
  bitmap::BitmapArray<long>::iterator::operator[]
            (in_stack_ffffffffffffff10._0_8_,in_stack_ffffffffffffff08);
  this = (value_reference *)
         bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x127de9);
  bitmap::BitmapArray<long>::iterator::operator[]
            (in_stack_ffffffffffffff10._0_8_,in_stack_ffffffffffffff08);
  lVar1 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x127e23);
  local_28 = in_R8;
  while( true ) {
    this_00 = in_stack_ffffffffffffff10._0_8_;
    local_40 = local_28 * 2 + 1;
    if (in_R9 <= local_40) break;
    bitmap::BitmapArray<long>::iterator::operator[](this_00,in_stack_ffffffffffffff08);
    bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x127e90);
    bitmap::BitmapArray<long>::iterator::operator[]
              (in_stack_ffffffffffffff10._0_8_,in_stack_ffffffffffffff08);
    local_58 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                         ((value_reference *)0x127eb7);
    in_stack_ffffffffffffff08 = local_58;
    bitmap::BitmapArray<long>::iterator::operator[](in_stack_ffffffffffffff10._0_8_,local_58);
    bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x127ef5);
    bitmap::BitmapArray<long>::iterator::operator[]
              (in_stack_ffffffffffffff10._0_8_,in_stack_ffffffffffffff08);
    lVar2 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x127f19)
    ;
    this_00 = in_stack_ffffffffffffff10._0_8_;
    if (in_stack_ffffffffffffff08 < lVar2) {
      local_58 = lVar2;
      local_40 = local_28 * 2 + 2;
    }
    if (local_58 <= lVar1) break;
    bitmap::BitmapArray<long>::iterator::operator[](this_00,in_stack_ffffffffffffff08);
    bitmap::BitmapArray<long>::iterator::operator[]
              (in_stack_ffffffffffffff10._0_8_,in_stack_ffffffffffffff08);
    bitmap::BitmapArray<long>::value_reference::operator=
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    local_28 = local_40;
  }
  bitmap::BitmapArray<long>::iterator::operator[](this_00,in_stack_ffffffffffffff08);
  bitmap::BitmapArray<long>::value_reference::operator=(this,(long)in_stack_fffffffffffffef8);
  return;
}

Assistant:

void fixdown(const StringIterator_type Td, SAIterator_type SA, pos_type i,
             pos_type size) {
  typedef typename std::iterator_traits<StringIterator_type>::value_type value_type;
  pos_type j, k, t;
  value_type c, d, e;

  for (t = SA[i], c = Td[t]; (j = 2 * i + 1) < size; SA[i] = SA[k], i = k) {
    d = Td[SA[k = j++]];
    if (d < (e = Td[SA[j]])) {
      k = j;
      d = e;
    }
    if (d <= c) {
      break;
    }
  }
  SA[i] = t;
}